

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O0

sljit_s32 sljit_emit_cmov(sljit_compiler *compiler,sljit_s32 type,sljit_s32 dst_reg,sljit_s32 src,
                         sljit_sw srcw)

{
  sljit_u8 sVar1;
  sljit_s32 sVar2;
  sljit_u8 *psVar3;
  sljit_u8 *inst;
  sljit_sw srcw_local;
  sljit_s32 src_local;
  sljit_s32 dst_reg_local;
  sljit_s32 type_local;
  sljit_compiler *compiler_local;
  
  if (compiler->error == 0) {
    sVar2 = sljit_has_cpu_feature(3);
    if (sVar2 == 0) {
      compiler_local._4_4_ = sljit_emit_cmov_generic(compiler,type,dst_reg,src,srcw);
    }
    else {
      compiler->mode32 = dst_reg & 0x100;
      inst = (sljit_u8 *)srcw;
      srcw_local._4_4_ = src;
      if ((src & 0x40U) != 0) {
        sVar2 = emit_mov(compiler,0xf,0,0x40,srcw);
        if (sVar2 != 0) {
          return compiler->error;
        }
        srcw_local._4_4_ = 0xf;
        inst = (sljit_u8 *)0x0;
      }
      psVar3 = emit_x86_instruction
                         (compiler,2,dst_reg & 0xfffffeff,0,srcw_local._4_4_,(sljit_sw)inst);
      if (psVar3 == (sljit_u8 *)0x0) {
        compiler_local._4_4_ = compiler->error;
      }
      else {
        *psVar3 = '\x0f';
        sVar1 = get_jump_code(type & 0xff);
        psVar3[1] = sVar1 + 0xc0;
        compiler_local._4_4_ = 0;
      }
    }
  }
  else {
    compiler_local._4_4_ = compiler->error;
  }
  return compiler_local._4_4_;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_cmov(struct sljit_compiler *compiler, sljit_s32 type,
	sljit_s32 dst_reg,
	sljit_s32 src, sljit_sw srcw)
{
	sljit_u8* inst;

	CHECK_ERROR();
	CHECK(check_sljit_emit_cmov(compiler, type, dst_reg, src, srcw));

#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
	dst_reg &= ~SLJIT_I32_OP;

	if (!sljit_has_cpu_feature(SLJIT_HAS_CMOV) || (dst_reg >= SLJIT_R3 && dst_reg <= SLJIT_S3))
		return sljit_emit_cmov_generic(compiler, type, dst_reg, src, srcw);
#else
	if (!sljit_has_cpu_feature(SLJIT_HAS_CMOV))
		return sljit_emit_cmov_generic(compiler, type, dst_reg, src, srcw);
#endif

	/* ADJUST_LOCAL_OFFSET is not needed. */
	CHECK_EXTRA_REGS(src, srcw, (void)0);

#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
	compiler->mode32 = dst_reg & SLJIT_I32_OP;
	dst_reg &= ~SLJIT_I32_OP;
#endif

	if (SLJIT_UNLIKELY(src & SLJIT_IMM)) {
		EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_IMM, srcw);
		src = TMP_REG1;
		srcw = 0;
	}

	inst = emit_x86_instruction(compiler, 2, dst_reg, 0, src, srcw);
	FAIL_IF(!inst);
	*inst++ = GROUP_0F;
	*inst = get_jump_code(type & 0xff) - 0x40;
	return SLJIT_SUCCESS;
}